

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::FlatHashMap_MergeExtractInsert_Test::
~FlatHashMap_MergeExtractInsert_Test(FlatHashMap_MergeExtractInsert_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, MergeExtractInsert) {
  // We can't test mutable keys, or non-copyable keys with ThisMap.
  // Test that the nodes have the proper API.
  ThisMap<int, int> m = {{1, 7}, {2, 9}};
  auto node = m.extract(1);
  EXPECT_TRUE(node);
  EXPECT_EQ(node.key(), 1);
  EXPECT_EQ(node.mapped(), 7);
  EXPECT_THAT(m, UnorderedElementsAre(Pair(2, 9)));

  node.mapped() = 17;
  m.insert(std::move(node));
  EXPECT_THAT(m, UnorderedElementsAre(Pair(1, 17), Pair(2, 9)));
}